

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O2

void __thiscall net_uv::KCPServer::onNewConnect(KCPServer *this,Socket *socket)

{
  KCPSession *session;
  char *format;
  function<void_(net_uv::Session_*,_char_*,_unsigned_int)> fStack_58;
  _Bind<void_(net_uv::KCPServer::*(net_uv::KCPServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(net_uv::Session_*,_char_*,_unsigned_int)>
  local_38;
  
  if (socket == (Socket *)0x0) {
    format = "Failed to accept new connection";
  }
  else {
    session = KCPSession::createSession
                        (&(this->super_Server).super_SessionManager,(KCPSocket *)socket);
    if (session != (KCPSession *)0x0) {
      local_38._M_f = (offset_in_KCPServer_to_subr)onSessionRecvData;
      local_38._8_8_ = 0;
      local_38._M_bound_args.
      super__Tuple_impl<0UL,_net_uv::KCPServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
      .super__Head_base<0UL,_net_uv::KCPServer_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_net_uv::KCPServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
            )(_Tuple_impl<0UL,_net_uv::KCPServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
              )this;
      std::function<void(net_uv::Session*,char*,unsigned_int)>::
      function<std::_Bind<void(net_uv::KCPServer::*(net_uv::KCPServer*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(net_uv::Session*,char*,unsigned_int)>,void>
                ((function<void(net_uv::Session*,char*,unsigned_int)> *)&fStack_58,&local_38);
      std::function<void_(net_uv::Session_*,_char_*,_unsigned_int)>::operator=
                (&(session->super_Session).m_sessionRecvCallback,&fStack_58);
      std::_Function_base::~_Function_base(&fStack_58.super__Function_base);
      local_38._M_f = (offset_in_KCPServer_to_subr)onSessionClose;
      local_38._8_8_ = 0;
      local_38._M_bound_args.
      super__Tuple_impl<0UL,_net_uv::KCPServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
      .super__Head_base<0UL,_net_uv::KCPServer_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_net_uv::KCPServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
            )(_Tuple_impl<0UL,_net_uv::KCPServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
              )this;
      std::function<void(net_uv::Session*)>::
      function<std::_Bind<void(net_uv::KCPServer::*(net_uv::KCPServer*,std::_Placeholder<1>))(net_uv::Session*)>,void>
                ((function<void(net_uv::Session*)> *)&fStack_58,
                 (_Bind<void_(net_uv::KCPServer::*(net_uv::KCPServer_*,_std::_Placeholder<1>))(net_uv::Session_*)>
                  *)&local_38);
      std::function<void_(net_uv::Session_*)>::operator=
                (&(session->super_Session).m_sessionCloseCallback,
                 (function<void_(net_uv::Session_*)> *)&fStack_58);
      std::_Function_base::~_Function_base(&fStack_58.super__Function_base);
      (session->super_Session).m_sessionID =
           *(uint32_t *)((long)&socket[1].m_connectCall.super__Function_base._M_functor + 8);
      (*(session->super_Session)._vptr_Session[0xb])(session,1);
      addNewSession(this,session);
      return;
    }
    format = "The server failed to create a new session.";
  }
  net_uvLog(3,format);
  return;
}

Assistant:

void KCPServer::onNewConnect(Socket* socket)
{
	if (socket != NULL)
	{
		KCPSession* session = KCPSession::createSession(this, (KCPSocket*)socket);
		if (session == NULL)
		{
			NET_UV_LOG(NET_UV_L_ERROR, "The server failed to create a new session.");
		}
		else
		{
			session->setSessionRecvCallback(std::bind(&KCPServer::onSessionRecvData, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3));
			session->setSessionClose(std::bind(&KCPServer::onSessionClose, this, std::placeholders::_1));
			session->setSessionID(((KCPSocket*)socket)->getConv());
			session->setIsOnline(true);
			addNewSession(session);
		}
	}
	else
	{
		NET_UV_LOG(NET_UV_L_ERROR, "Failed to accept new connection");
	}
}